

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.h
# Opt level: O0

EventLogEntry * __thiscall
TTD::TTEventList::GetNextAvailableEntry<TTD::NSLogEvents::JsRTCodeParseAction>(TTEventList *this)

{
  byte *pbVar1;
  size_t sVar2;
  EventLogEntry *entry;
  size_t esize;
  TTEventList *this_local;
  
  if ((this->m_headBlock == (TTEventListLink *)0x0) || (0xffff < this->m_headBlock->CurrPos + 0x50))
  {
    AddArrayLink(this);
  }
  pbVar1 = this->m_headBlock->BlockData;
  sVar2 = this->m_headBlock->CurrPos;
  this->m_headBlock->CurrPos = this->m_headBlock->CurrPos + 0x50;
  return (EventLogEntry *)(pbVar1 + sVar2);
}

Assistant:

NSLogEvents::EventLogEntry* GetNextAvailableEntry() 
        {
            const size_t esize = TTD_EVENT_PLUS_DATA_SIZE(T);
            if((this->m_headBlock == nullptr) || (this->m_headBlock->CurrPos + esize >= TTD_EVENTLOG_LIST_BLOCK_SIZE))
            {
                this->AddArrayLink();
            }

            NSLogEvents::EventLogEntry* entry = reinterpret_cast<NSLogEvents::EventLogEntry*>(this->m_headBlock->BlockData + this->m_headBlock->CurrPos);
            this->m_headBlock->CurrPos += esize;

            return entry;
        }